

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc.c
# Opt level: O3

void ipc_pipe_send(void *arg,nni_aio *aio)

{
  _Bool _Var1;
  nni_aio *pnVar2;
  
  nni_aio_reset(aio);
  nni_mtx_lock((nni_mtx *)((long)arg + 0x608));
  _Var1 = nni_aio_start(aio,ipc_pipe_send_cancel,arg);
  if (_Var1) {
    nni_list_append((nni_list *)((long)arg + 0x90),aio);
    pnVar2 = (nni_aio *)nni_list_first((nni_list *)((long)arg + 0x90));
    if (pnVar2 == aio) {
      ipc_pipe_send_start((ipc_pipe *)arg);
    }
  }
  nni_mtx_unlock((nni_mtx *)((long)arg + 0x608));
  return;
}

Assistant:

static void
ipc_pipe_send(void *arg, nni_aio *aio)
{
	ipc_pipe *p = arg;

	nni_aio_reset(aio);
	nni_mtx_lock(&p->mtx);
	if (!nni_aio_start(aio, ipc_pipe_send_cancel, p)) {
		nni_mtx_unlock(&p->mtx);
		return;
	}
	nni_list_append(&p->send_q, aio);
	if (nni_list_first(&p->send_q) == aio) {
		ipc_pipe_send_start(p);
	}
	nni_mtx_unlock(&p->mtx);
}